

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdRequestExecuteJson(void *handle,char *name,char *json_string,char **response_json_string)

{
  bool bVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *pcVar4;
  undefined8 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  string command;
  string result;
  char *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffe00;
  CfdException *this;
  string *in_stack_fffffffffffffe38;
  string *request_message;
  string *in_stack_fffffffffffffe50;
  undefined1 local_179 [40];
  allocator local_151;
  string local_150 [32];
  string local_130 [39];
  undefined1 local_109 [33];
  string local_e8 [39];
  undefined1 local_c1 [33];
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  undefined8 *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  if (((in_RSI == (char *)0x0) || (in_RDX == (char *)0x0)) || (in_RCX == (undefined8 *)0x0)) {
    local_4 = 1;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    std::__cxx11::string::string(local_48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,local_18,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    bVar1 = std::operator==(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    if (bVar1) {
      in_stack_fffffffffffffe50 = (string *)local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_c1 + 1),local_20,(allocator *)in_stack_fffffffffffffe50);
      cfd::api::json::JsonMappingApi::ElementsDecodeRawTransaction(in_stack_fffffffffffffe38);
      std::__cxx11::string::operator=(local_48,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string((string *)(local_c1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_c1);
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      if (bVar1) {
        request_message = (string *)local_109;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_109 + 1),local_20,(allocator *)request_message);
        cfd::api::json::JsonMappingApi::DecodeRawTransaction(request_message);
        std::__cxx11::string::operator=(local_48,local_e8);
        std::__cxx11::string::~string(local_e8);
        std::__cxx11::string::~string((string *)(local_109 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_109);
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        if (!bVar1) {
          uVar2 = __cxa_allocate_exception(0x30);
          this = (CfdException *)local_179;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_179 + 1),"unknown request name.",(allocator *)this);
          cfd::core::CfdException::CfdException
                    (this,(CfdError)((ulong)uVar2 >> 0x20),in_stack_fffffffffffffe00);
          __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,
                      cfd::core::CfdException::~CfdException);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,local_20,&local_151);
        cfd::api::json::JsonMappingApi::DecodePsbt(in_stack_fffffffffffffe38);
        std::__cxx11::string::operator=(local_48,local_130);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
      }
    }
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) && (local_28 != (undefined8 *)0x0)) {
      pcVar4 = cfd::capi::CreateString(in_stack_fffffffffffffe50);
      *local_28 = pcVar4;
    }
    local_4 = 0;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
  }
  return local_4;
}

Assistant:

int CfdRequestExecuteJson(
    void* handle, const char* name, const char* json_string,
    char** response_json_string) {
#ifndef CFD_DISABLE_JSONAPI
  using cfd::api::json::JsonMappingApi;
  try {
    if ((name == nullptr) || (json_string == nullptr) ||
        (response_json_string == nullptr)) {
      return kCfdIllegalArgumentError;
    }

    std::string result;
    std::string command(name);
    if (command == "ElementsDecodeRawTransaction") {
#ifndef CFD_DISABLE_ELEMENTS
      result = JsonMappingApi::ElementsDecodeRawTransaction(
          std::string(json_string));
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "elements not support.");
#endif  // CFD_DISABLE_ELEMENTS
    } else if (command == "DecodeRawTransaction") {
      result = JsonMappingApi::DecodeRawTransaction(std::string(json_string));
    } else if (command == "DecodePsbt") {
      result = JsonMappingApi::DecodePsbt(std::string(json_string));
    } else {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "unknown request name.");
    }

    if (!result.empty() && (response_json_string != nullptr)) {
      *response_json_string = cfd::capi::CreateString(result);
    }
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
#else
  return kCfdIllegalStateError;
#endif  // CFD_DISABLE_JSONAPI
}